

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

void Assimp::BaseImporter::ConvertUTF8toISO8859_1(string *data)

{
  ulong uVar1;
  pointer pcVar2;
  ostream *poVar3;
  Logger *pLVar4;
  char cVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  stringstream stream;
  char *local_1d8 [4];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  ulong uVar9;
  
  uVar1 = data->_M_string_length;
  uVar8 = 0;
  lVar7 = 0;
  do {
    if (uVar1 <= uVar8) {
      std::__cxx11::string::resize((ulong)data);
      return;
    }
    pcVar2 = (data->_M_dataplus)._M_p;
    cVar5 = pcVar2[uVar8];
    uVar9 = uVar8;
    if (cVar5 < '\0') {
      if (uVar1 - 1 <= uVar8) {
        pLVar4 = DefaultLogger::get();
        Logger::error(pLVar4,"UTF8 code but only one character remaining");
        pcVar2 = (data->_M_dataplus)._M_p;
        cVar5 = pcVar2[uVar8];
        goto LAB_00395015;
      }
      if (cVar5 == -0x3d) {
        cVar5 = pcVar2[uVar8 + 1] + '@';
        uVar9 = uVar8 + 1;
        goto LAB_00395015;
      }
      if (cVar5 == -0x3e) {
        cVar5 = pcVar2[uVar8 + 1];
        uVar9 = uVar8 + 1;
        goto LAB_00395015;
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar3 = std::operator<<(local_1a8,"UTF8 code ");
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar3 = std::operator<<(poVar3,(data->_M_dataplus)._M_p[uVar8]);
      poVar3 = std::operator<<(poVar3,(data->_M_dataplus)._M_p[uVar8 + 1]);
      std::operator<<(poVar3," can not be converted into ISA-8859-1.");
      pLVar4 = DefaultLogger::get();
      std::__cxx11::stringbuf::str();
      Logger::error(pLVar4,local_1d8[0]);
      uVar9 = uVar8 + 1;
      std::__cxx11::string::~string((string *)local_1d8);
      pcVar2 = (data->_M_dataplus)._M_p;
      lVar6 = lVar7 + 1;
      pcVar2[lVar7] = pcVar2[uVar8];
      pcVar2 = (data->_M_dataplus)._M_p;
      pcVar2[lVar7 + 1] = pcVar2[uVar8 + 1];
      std::__cxx11::stringstream::~stringstream(local_1b8);
    }
    else {
LAB_00395015:
      pcVar2[lVar7] = cVar5;
      lVar6 = lVar7;
    }
    uVar8 = uVar9 + 1;
    lVar7 = lVar6 + 1;
  } while( true );
}

Assistant:

void BaseImporter::ConvertUTF8toISO8859_1(std::string& data)
{
    size_t size = data.size();
    size_t i = 0, j = 0;

    while(i < size) {
        if ((unsigned char) data[i] < (size_t) 0x80) {
            data[j] = data[i];
        } else if(i < size - 1) {
            if((unsigned char) data[i] == 0xC2) {
                data[j] = data[++i];
            } else if((unsigned char) data[i] == 0xC3) {
                data[j] = ((unsigned char) data[++i] + 0x40);
            } else {
                std::stringstream stream;
                stream << "UTF8 code " << std::hex << data[i] << data[i + 1] << " can not be converted into ISA-8859-1.";
                ASSIMP_LOG_ERROR( stream.str() );

                data[j++] = data[i++];
                data[j] = data[i];
            }
        } else {
            ASSIMP_LOG_ERROR("UTF8 code but only one character remaining");

            data[j] = data[i];
        }

        i++; j++;
    }

    data.resize(j);
}